

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResultTest.cpp
# Opt level: O2

void __thiscall
TEST_TestResult_TestEndedWillPrintResultsAndExecutionTime_Test::testBody
          (TEST_TestResult_TestEndedWillPrintResultsAndExecutionTime_Test *this)

{
  StringBufferTestOutput *pSVar1;
  bool bVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_30;
  
  (*((this->super_TEST_GROUP_CppUTestGroupTestResult).res)->_vptr_TestResult[3])();
  pUVar3 = UtestShell::getCurrent();
  pSVar1 = (this->super_TEST_GROUP_CppUTestGroupTestResult).mock;
  SimpleString::SimpleString(&local_30,"10 ms");
  bVar2 = SimpleString::contains(&pSVar1->output,&local_30);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar2,"CHECK","mock->getOutput().contains(\"10 ms\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestResultTest.cpp"
             ,0x41,pTVar4);
  SimpleString::~SimpleString(&local_30);
  return;
}

Assistant:

TEST(TestResult, TestEndedWillPrintResultsAndExecutionTime)
{
    res->testsEnded();
    CHECK(mock->getOutput().contains("10 ms"));
}